

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Lexer::ParseName(Lexer *this)

{
  Lexer *pLVar1;
  byte bVar2;
  char *pcVar3;
  byte bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  Lexer *utf8Str;
  Lexer *pLVar10;
  char *pcVar11;
  string_view name;
  string_view name_00;
  
  utf8Str = (Lexer *)this->m_current;
  bVar2 = *(byte *)&(utf8Str->m_name)._M_dataplus._M_p;
  pLVar10 = this;
  bVar4 = bVar2;
  if (bVar2 == 0x27) {
    sVar8 = GetUtf8CharSize((char *)utf8Str);
    pcVar11 = this->m_current;
    pLVar1 = (Lexer *)(pcVar11 + sVar8);
    this->m_current = (char *)pLVar1;
    this->m_columnNumber = this->m_columnNumber + 1;
    pLVar10 = utf8Str;
    utf8Str = pLVar1;
    bVar4 = pcVar11[sVar8];
  }
  if ((((byte)(bVar4 - 0x2d) < 2) || (bVar4 - 0x30 < 10)) ||
     (bVar5 = IsName(pLVar10,(char *)utf8Str), pLVar10 = utf8Str, !bVar5)) {
    Error<>(this,"Invalid character in name");
    pLVar10 = (Lexer *)this->m_current;
  }
  while( true ) {
    sVar8 = GetUtf8CharSize((char *)pLVar10);
    pcVar11 = this->m_current;
    pLVar1 = (Lexer *)(pcVar11 + sVar8);
    this->m_current = (char *)pLVar1;
    this->m_columnNumber = this->m_columnNumber + 1;
    cVar6 = pcVar11[sVar8];
    if ((cVar6 == '\0') || ((Lexer *)this->m_end < pLVar1)) break;
    if (bVar2 == 0x27) {
      pLVar10 = pLVar1;
      if (cVar6 == '\'') {
        sVar8 = (long)pLVar1 - (long)utf8Str;
LAB_001f70ee:
        sVar9 = GetUtf8CharSize((char *)pLVar1);
        this->m_current = this->m_current + sVar9;
        this->m_columnNumber = this->m_columnNumber + 1;
        name_00._M_str = (char *)utf8Str;
        name_00._M_len = sVar8;
        CreateSymbol(this,name_00);
        pcVar11 = this->m_current;
        cVar6 = *pcVar11;
LAB_001f7112:
        iVar7 = tolower((int)cVar6);
        if (iVar7 == 0x73) {
          sVar8 = GetUtf8CharSize(pcVar11);
          this->m_current = this->m_current + sVar8;
          this->m_columnNumber = this->m_columnNumber + 1;
        }
        return;
      }
    }
    else {
      bVar5 = IsName(pLVar10,(char *)pLVar1);
      pLVar10 = pLVar1;
      if (!bVar5) {
        sVar8 = (long)pLVar1 - (long)utf8Str;
        goto LAB_001f70a6;
      }
    }
  }
  sVar8 = (long)pLVar1 - (long)utf8Str;
  if (bVar2 == 0x27) goto LAB_001f70ee;
LAB_001f70a6:
  name._M_str = (char *)utf8Str;
  name._M_len = sVar8;
  CreateSymbol(this,name);
  pcVar11 = this->m_current;
  cVar6 = *pcVar11;
  if (cVar6 == '\'') {
    sVar8 = GetUtf8CharSize(pcVar11);
    pcVar3 = this->m_current;
    pcVar11 = pcVar3 + sVar8;
    this->m_current = pcVar11;
    this->m_columnNumber = this->m_columnNumber + 1;
    cVar6 = pcVar3[sVar8];
    if (cVar6 == '\0') {
      return;
    }
    if (this->m_end < pcVar11) {
      return;
    }
  }
  goto LAB_001f7112;
}

Assistant:

inline_t void Lexer::ParseName()
	{
		bool quotedName = false;
		if (*m_current == '\'')
		{
			quotedName = true;
			AdvanceCurrent();
		}

		const char * startName = m_current;

		if (!IsNameStart(m_current))
			Error("Invalid character in name");
		AdvanceCurrent();

		// Advance until we reach the end of the text or hit a non-name character
		while (!IsEndOfText())
		{
			if (quotedName)
			{
				if (*m_current == '\'')
					break;
			}
			else
			{
				if (!IsName(m_current))
					break;
			}
			AdvanceCurrent();
		}
		size_t count = m_current - startName;
		if (quotedName)
			AdvanceCurrent();
		CreateSymbol(std::string_view(startName, count));

		// Check for apostrophe-s.  If the name is quoted, no additional quote is needed
		if (!quotedName)
		{
			if (*m_current == '\'')
			{
				AdvanceCurrent();
				if (IsEndOfText())
					return;
			}
		}
		if (std::tolower(*m_current) == 's')
			AdvanceCurrent();
	}